

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  void **ppvVar2;
  void *pvVar3;
  shared_container_t *c1;
  uint16_t *puVar4;
  int iVar5;
  byte type2;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  undefined8 *c2;
  int iVar9;
  ulong uVar10;
  uint8_t uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint32_t begin;
  ulong uVar18;
  uint16_t uVar19;
  uint uVar20;
  uint16_t uVar21;
  uint32_t new_begin;
  int iVar22;
  long lVar23;
  bool bVar24;
  uint8_t result_type;
  uint8_t local_81 [9];
  shared_container_t *local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  ulong local_58;
  uint32_t local_4c;
  roaring_bitmap_t *local_48;
  long local_40;
  int *local_38;
  
  local_81[0] = '\0';
  uVar17 = (x2->high_low_container).size;
  if (uVar17 == 0) {
    return;
  }
  local_4c = (x1->high_low_container).size;
  if (local_4c == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  uVar21 = *(x1->high_low_container).keys;
  uVar19 = *(x2->high_low_container).keys;
  local_58 = (ulong)(1 - local_4c);
  local_68 = 0;
  uVar6 = 0;
  local_70 = 0;
LAB_00107741:
  do {
    uVar18 = uVar6 & 0xffffffff;
    iVar9 = (int)uVar6;
    iVar7 = (int)local_70;
    uVar10 = local_70 & 0xffffffff;
    lVar13 = (long)iVar7;
    local_40 = lVar13 * 8;
    lVar23 = 0;
    while( true ) {
      uVar6 = uVar18 + lVar23;
      uVar14 = lVar23 + uVar10;
      iVar22 = (int)lVar23;
      uVar20 = (uint)local_68;
      if (uVar21 == uVar19) break;
      if (uVar19 <= uVar21) {
        puVar4 = (x2->high_low_container).keys;
        uVar12 = (x2->high_low_container).size;
        uVar10 = (ulong)uVar12;
        uVar16 = uVar20 + 1;
        if (((int)uVar12 <= (int)uVar16) || (uVar21 <= puVar4[(int)uVar16])) {
          uVar10 = (ulong)uVar16;
          goto LAB_001078ad;
        }
        uVar20 = uVar20 + 2;
        iVar15 = 1;
        if ((int)uVar12 <= (int)uVar20) goto LAB_00107894;
        iVar15 = 1;
        goto LAB_00107878;
      }
      if ((int)uVar14 != (int)uVar6) {
        ppvVar2 = (x1->high_low_container).containers;
        uVar11 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
        pvVar3 = ppvVar2[uVar6 & 0xffff];
        (x1->high_low_container).keys[lVar13 + lVar23] = uVar21;
        ppvVar2[lVar13 + lVar23] = pvVar3;
        (x1->high_low_container).typecodes[lVar23 + lVar13] = uVar11;
      }
      if ((int)local_58 + iVar9 + iVar22 == 0) {
        begin = iVar9 + iVar22 + 1;
        new_begin = iVar22 + iVar7 + 1;
        goto LAB_00107b31;
      }
      uVar21 = (x1->high_low_container).keys[(ushort)((short)uVar18 + (short)lVar23 + 1)];
      lVar23 = lVar23 + 1;
    }
    uVar12 = iVar9 + iVar22 & 0xffff;
    bVar1 = (x1->high_low_container).typecodes[uVar12];
    c1 = (shared_container_t *)(x1->high_low_container).containers[uVar12];
    type2 = (x2->high_low_container).typecodes[uVar20 & 0xffff];
    c2 = (undefined8 *)(x2->high_low_container).containers[uVar20 & 0xffff];
    local_5c = uVar17;
    local_48 = x2;
    if (bVar1 != 4) {
      if (type2 == 4) {
        type2 = *(byte *)(c2 + 1);
        c2 = (undefined8 *)*c2;
      }
      local_81[1] = '\0';
      local_81[2] = '\0';
      local_81[3] = '\0';
      local_81[4] = '\0';
      local_81[5] = '\0';
      local_81[6] = '\0';
      local_81[7] = '\0';
      local_81[8] = '\0';
      (*(code *)(&DAT_00120304 +
                *(int *)(&DAT_00120304 + (ulong)(((uint)type2 + (uint)bVar1 * 4) - 5) * 4)))
                (c1,bVar1,c2);
      return;
    }
    local_78 = c1;
    local_38 = (int *)container_andnot(c1,'\x04',c2,type2,local_81);
    shared_container_free(local_78);
    piVar8 = local_38;
    uVar11 = local_81[0];
    if (local_81[0] == '\x04') {
      uVar11 = (uint8_t)local_38[2];
      piVar8 = *(int **)local_38;
    }
    iVar15 = *piVar8;
    if ((uVar11 == '\x03') || (uVar11 == '\x02')) {
      bVar24 = 0 < iVar15;
    }
    else {
      if (iVar15 == -1) {
        if (**(long **)(piVar8 + 2) == 0) {
          uVar6 = 0xffffffffffffffff;
          do {
            if (uVar6 == 0x3fe) {
              uVar14 = 0x3ff;
              break;
            }
            uVar14 = uVar6 + 1;
            lVar13 = uVar6 + 2;
            uVar6 = uVar14;
          } while ((*(long **)(piVar8 + 2))[lVar13] == 0);
          bVar24 = 0x3fe < uVar14;
        }
        else {
          bVar24 = false;
        }
      }
      else {
        bVar24 = iVar15 == 0;
      }
      bVar24 = (bool)(bVar24 ^ 1);
    }
    if (bVar24) {
      (x1->high_low_container).keys[iVar7 + lVar23] = uVar21;
      *(int **)((long)(x1->high_low_container).containers + lVar23 * 8 + local_40) = local_38;
      (x1->high_low_container).typecodes[lVar23 + iVar7] = local_81[0];
      local_70 = (ulong)((int)local_70 + iVar22 + 1);
    }
    else {
      container_free(local_38,local_81[0]);
      local_70 = uVar10 + lVar23;
    }
    uVar6 = uVar18 + lVar23 + 1;
    uVar20 = (int)local_68 + 1;
    if (uVar20 == local_5c || iVar22 + (int)local_58 + iVar9 == 0) {
      begin = iVar9 + iVar22 + 1;
      new_begin = (uint32_t)local_70;
LAB_00107b31:
      iVar9 = local_4c - begin;
      if (iVar9 != 0 && (int)begin <= (int)local_4c) {
        if ((int)new_begin < (int)begin) {
          ra_copy_range(&x1->high_low_container,begin,local_4c,new_begin);
        }
        new_begin = iVar9 + new_begin;
      }
      ra_downsize(&x1->high_low_container,new_begin);
      return;
    }
    uVar21 = (x1->high_low_container).keys[(uint)uVar6 & 0xffff];
    uVar19 = (local_48->high_low_container).keys[uVar20 & 0xffff];
    x2 = local_48;
    uVar17 = local_5c;
    local_68 = (ulong)uVar20;
  } while( true );
  while( true ) {
    iVar5 = iVar15 * 2;
    uVar20 = uVar16 + iVar15 * 2;
    iVar15 = iVar5;
    if ((int)uVar12 <= (int)uVar20) break;
LAB_00107878:
    if (uVar21 <= puVar4[(int)uVar20]) goto LAB_0010789b;
  }
LAB_00107894:
  uVar20 = uVar12 - 1;
LAB_0010789b:
  if (puVar4[(int)uVar20] != uVar21) {
    if (puVar4[(int)uVar20] < uVar21) goto LAB_001078ad;
    if ((iVar15 >> 1) + uVar16 + 1 != uVar20) {
      uVar16 = (iVar15 >> 1) + uVar16;
      do {
        uVar12 = (int)(uVar16 + uVar20) >> 1;
        uVar10 = (ulong)uVar12;
        if (puVar4[(int)uVar12] == uVar21) break;
        if (puVar4[(int)uVar12] < uVar21) {
          uVar10 = (ulong)uVar20;
          uVar16 = uVar12;
        }
        uVar20 = (uint)uVar10;
      } while (uVar16 + 1 != uVar20);
      goto LAB_001078ad;
    }
  }
  uVar10 = (ulong)uVar20;
LAB_001078ad:
  if ((uint)uVar10 == uVar17) {
    begin = iVar9 + iVar22;
    new_begin = iVar7 + iVar22;
    goto LAB_00107b31;
  }
  uVar19 = puVar4[uVar10 & 0xffff];
  local_70 = uVar14;
  local_68 = uVar10;
  goto LAB_00107741;
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            } else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                    &x1->high_low_container, (uint16_t)pos1, &type1);

                ra_replace_key_and_container_at_index(
                    &x1->high_low_container, intersection_size, s1, c1, type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}